

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7.cc
# Opt level: O0

int pkcs7_parse_header(uint8_t **der_bytes,CBS *out,CBS *cbs)

{
  int iVar1;
  uint8_t *data;
  size_t len;
  uint64_t local_80;
  uint64_t version;
  CBS signed_data;
  CBS wrapped_signed_data;
  CBS content_type;
  CBS content_info;
  CBS in;
  CBS *cbs_local;
  CBS *out_local;
  uint8_t **der_bytes_local;
  
  *der_bytes = (uint8_t *)0x0;
  iVar1 = CBS_asn1_ber_to_der(cbs,(CBS *)&content_info.len,der_bytes);
  if (((iVar1 != 0) &&
      (iVar1 = CBS_get_asn1((CBS *)&content_info.len,(CBS *)&content_type.len,0x20000010),
      iVar1 != 0)) &&
     (iVar1 = CBS_get_asn1((CBS *)&content_type.len,(CBS *)&wrapped_signed_data.len,6), iVar1 != 0))
  {
    iVar1 = CBS_mem_equal((CBS *)&wrapped_signed_data.len,kPKCS7SignedData,9);
    if (iVar1 == 0) {
      ERR_put_error(0x12,0,0x65,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7.cc"
                    ,0x3a);
    }
    else {
      iVar1 = CBS_get_asn1((CBS *)&content_type.len,(CBS *)&signed_data.len,0xa0000000);
      if (((iVar1 != 0) &&
          (iVar1 = CBS_get_asn1((CBS *)&signed_data.len,(CBS *)&version,0x20000010), iVar1 != 0)) &&
         ((iVar1 = CBS_get_asn1_uint64((CBS *)&version,&local_80), iVar1 != 0 &&
          ((iVar1 = CBS_get_asn1((CBS *)&version,(CBS *)0x0,0x20000011), iVar1 != 0 &&
           (iVar1 = CBS_get_asn1((CBS *)&version,(CBS *)0x0,0x20000010), iVar1 != 0)))))) {
        if (local_80 != 0) {
          data = CBS_data((CBS *)&version);
          len = CBS_len((CBS *)&version);
          CBS_init(out,data,len);
          return 1;
        }
        ERR_put_error(0x12,0,100,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7.cc"
                      ,0x49);
      }
    }
  }
  OPENSSL_free(*der_bytes);
  *der_bytes = (uint8_t *)0x0;
  return 0;
}

Assistant:

int pkcs7_parse_header(uint8_t **der_bytes, CBS *out, CBS *cbs) {
  CBS in, content_info, content_type, wrapped_signed_data, signed_data;
  uint64_t version;

  // The input may be in BER format.
  *der_bytes = NULL;
  if (!CBS_asn1_ber_to_der(cbs, &in, der_bytes) ||
      // See https://tools.ietf.org/html/rfc2315#section-7
      !CBS_get_asn1(&in, &content_info, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1(&content_info, &content_type, CBS_ASN1_OBJECT)) {
    goto err;
  }

  if (!CBS_mem_equal(&content_type, kPKCS7SignedData,
                     sizeof(kPKCS7SignedData))) {
    OPENSSL_PUT_ERROR(PKCS7, PKCS7_R_NOT_PKCS7_SIGNED_DATA);
    goto err;
  }

  // See https://tools.ietf.org/html/rfc2315#section-9.1
  if (!CBS_get_asn1(&content_info, &wrapped_signed_data,
                    CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 0) ||
      !CBS_get_asn1(&wrapped_signed_data, &signed_data, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1_uint64(&signed_data, &version) ||
      !CBS_get_asn1(&signed_data, NULL /* digests */, CBS_ASN1_SET) ||
      !CBS_get_asn1(&signed_data, NULL /* content */, CBS_ASN1_SEQUENCE)) {
    goto err;
  }

  if (version < 1) {
    OPENSSL_PUT_ERROR(PKCS7, PKCS7_R_BAD_PKCS7_VERSION);
    goto err;
  }

  CBS_init(out, CBS_data(&signed_data), CBS_len(&signed_data));
  return 1;

err:
  OPENSSL_free(*der_bytes);
  *der_bytes = NULL;
  return 0;
}